

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

bool __thiscall kwssys::RegularExpression::compile(RegularExpression *this,char *exp)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  size_t len;
  int flags;
  RegExpCompile local_50;
  
  if (exp == (char *)0x0) {
    pcVar2 = "RegularExpression::compile(): No expression supplied.";
  }
  else {
    local_50.regnpar = 1;
    local_50.regcode = &regdummy;
    local_50.regsize = 1;
    local_50.regparse = exp;
    pcVar2 = RegExpCompile::reg(&local_50,0,&flags);
    lVar1 = local_50.regsize;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = "RegularExpression::compile(): Error in compile.";
    }
    else {
      (this->regmatch).startp[0] = (char *)0x0;
      (this->regmatch).endp[0] = (char *)0x0;
      (this->regmatch).searchstring = (char *)0x0;
      if (local_50.regsize < 0xffff) {
        if (this->program != (char *)0x0) {
          operator_delete__(this->program);
        }
        uVar5 = 0xffffffffffffffff;
        if (-1 < lVar1) {
          uVar5 = lVar1;
        }
        pcVar2 = (char *)operator_new__(uVar5);
        this->program = pcVar2;
        this->progsize = (int)lVar1;
        local_50.regnpar = 1;
        local_50.regcode = pcVar2 + 1;
        *pcVar2 = -100;
        local_50.regparse = exp;
        RegExpCompile::reg(&local_50,0,&flags);
        this->regstart = '\0';
        this->reganch = '\0';
        this->regmust = (char *)0x0;
        this->regmlen = 0;
        pcVar2 = this->program;
        pcVar3 = regnext(pcVar2 + 1);
        if (*pcVar3 != '\0') {
          return true;
        }
        if (pcVar2[4] == '\x01') {
          this->reganch = '\x01';
        }
        else if (pcVar2[4] == '\b') {
          this->regstart = pcVar2[7];
        }
        if (((byte)flags & 4) == 0) {
          return true;
        }
        pcVar3 = (char *)0x0;
        uVar5 = 0;
        for (pcVar2 = pcVar2 + 4; pcVar2 != (char *)0x0; pcVar2 = regnext(pcVar2)) {
          if (*pcVar2 == '\b') {
            sVar4 = strlen(pcVar2 + 3);
            if (uVar5 <= sVar4) {
              pcVar3 = pcVar2 + 3;
            }
            if (uVar5 < sVar4) {
              uVar5 = sVar4;
            }
          }
        }
        this->regmust = pcVar3;
        this->regmlen = uVar5;
        return true;
      }
      pcVar2 = "RegularExpression::compile(): Expression too big.";
    }
  }
  puts(pcVar2);
  return false;
}

Assistant:

bool RegularExpression::compile(const char* exp)
{
  const char* scan;
  const char* longest;
  int flags;

  if (exp == nullptr) {
    // RAISE Error, SYM(RegularExpression), SYM(No_Expr),
    printf("RegularExpression::compile(): No expression supplied.\n");
    return false;
  }

  // First pass: determine size, legality.
  RegExpCompile comp;
  comp.regparse = exp;
  comp.regnpar = 1;
  comp.regsize = 0L;
  comp.regcode = regdummyptr;
  comp.regc(static_cast<char>(MAGIC));
  if (!comp.reg(0, &flags)) {
    printf("RegularExpression::compile(): Error in compile.\n");
    return false;
  }
  this->regmatch.clear();

  // Small enough for pointer-storage convention?
  if (comp.regsize >= 65535L) {
    // RAISE Error, SYM(RegularExpression), SYM(Expr_Too_Big),
    printf("RegularExpression::compile(): Expression too big.\n");
    return false;
  }

  // Allocate space.
  // #ifndef _WIN32
  delete[] this->program;
  // #endif
  this->program = new char[comp.regsize];
  this->progsize = static_cast<int>(comp.regsize);

  if (this->program == nullptr) {
    // RAISE Error, SYM(RegularExpression), SYM(Out_Of_Memory),
    printf("RegularExpression::compile(): Out of memory.\n");
    return false;
  }

#ifdef __clang_analyzer__ /* Convince it that the program is initialized.  */
  memset(this->program, 0, comp.regsize);
#endif

  // Second pass: emit code.
  comp.regparse = exp;
  comp.regnpar = 1;
  comp.regcode = this->program;
  comp.regc(static_cast<char>(MAGIC));
  comp.reg(0, &flags);

  // Dig out information for optimizations.
  this->regstart = '\0'; // Worst-case defaults.
  this->reganch = 0;
  this->regmust = nullptr;
  this->regmlen = 0;
  scan = this->program + 1;       // First BRANCH.
  if (OP(regnext(scan)) == END) { // Only one top-level choice.
    scan = OPERAND(scan);

    // Starting-point info.
    if (OP(scan) == EXACTLY)
      this->regstart = *OPERAND(scan);
    else if (OP(scan) == BOL)
      this->reganch++;

    //
    // If there's something expensive in the r.e., find the longest
    // literal string that must appear and make it the regmust.  Resolve
    // ties in favor of later strings, since the regstart check works
    // with the beginning of the r.e. and avoiding duplication
    // strengthens checking.  Not a strong reason, but sufficient in the
    // absence of others.
    //
    if (flags & SPSTART) {
      longest = nullptr;
      size_t len = 0;
      for (; scan != nullptr; scan = regnext(scan))
        if (OP(scan) == EXACTLY && strlen(OPERAND(scan)) >= len) {
          longest = OPERAND(scan);
          len = strlen(OPERAND(scan));
        }
      this->regmust = longest;
      this->regmlen = len;
    }
  }
  return true;
}